

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestForward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  unsigned_long uVar1;
  bool bVar2;
  TestObject *pTVar3;
  pointer pTVar4;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar5;
  int line;
  long lVar6;
  unsigned_long uVar7;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  local_40 = 0;
  if (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_) {
    pTVar3 = *(TestObject **)(this + 8);
    lVar6 = 0;
    uVar1 = 1;
    do {
      uVar7 = uVar1;
      if (pTVar3 == (first->current).node_) {
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)(last->current).node_ - (long)(last->current).list_ >> 2);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_50,"count","expected.size()",&local_40,(unsigned_long *)&local_58);
        if (local_50[0] != (internal)0x0) goto LAB_001dee10;
        testing::Message::Message((Message *)&local_58);
        if (local_48.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xa6;
LAB_001dedd2:
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
        }
LAB_001dee10:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      piVar5 = (last->current).list_;
      pTVar4 = std::
               reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
               ::operator->((reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                             *)this);
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"expected[count]","first->data",(int *)((long)&piVar5->first_ + lVar6),
                 &pTVar4->data);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_48.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xa2;
        goto LAB_001dedd2;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      piVar5 = *(intrusive_list<(anonymous_namespace)::TestObject> **)(this + 8);
      if (*(intrusive_list<(anonymous_namespace)::TestObject> **)(this + 8) ==
          (intrusive_list<(anonymous_namespace)::TestObject> *)0x0) {
        piVar5 = *(intrusive_list<(anonymous_namespace)::TestObject> **)this;
      }
      pTVar3 = piVar5->last_;
      *(TestObject **)(this + 8) = pTVar3;
      lVar6 = lVar6 + 4;
      uVar1 = uVar7 + 1;
      local_40 = uVar7;
    } while (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_);
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0xfe,
                "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator==(const_iterator) const [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

void TestForward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      ASSERT_EQ(expected[count], first->data);
      ++first;
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }